

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sreadhb.c
# Opt level: O2

int sReadValues(FILE *fp,int n,float *destination,int perline,int persize)

{
  char cVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *__s;
  ulong uVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  char buf [100];
  
  lVar6 = 0;
  uVar5 = 0;
  if (0 < persize) {
    uVar5 = (ulong)(uint)persize;
  }
  lVar2 = (long)persize;
  while ((int)lVar6 < n) {
    __s = buf;
    fgets(__s,100,(FILE *)fp);
    lVar3 = 0;
    for (lVar6 = (long)(int)lVar6; (lVar3 < perline && (lVar6 < n)); lVar6 = lVar6 + 1) {
      lVar7 = (lVar3 + 1) * lVar2;
      cVar1 = buf[lVar7];
      buf[lVar7] = '\0';
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        if ((byte)(__s[uVar4] | 0x20U) == 100) {
          __s[uVar4] = 'E';
        }
      }
      dVar8 = atof(buf + lVar3 * lVar2);
      destination[lVar6] = (float)dVar8;
      buf[lVar7] = cVar1;
      __s = __s + lVar2;
      lVar3 = lVar3 + 1;
    }
  }
  return 0;
}

Assistant:

int sReadValues(FILE *fp, int n, float *destination, int perline, int persize)
{
    register int i, j, k, s;
    char tmp, buf[100];
    
    i = 0;
    while (i < n) {
	fgets(buf, 100, fp);    /* read a line at a time */
	for (j=0; j<perline && i<n; j++) {
	    tmp = buf[(j+1)*persize];     /* save the char at that place */
	    buf[(j+1)*persize] = 0;       /* null terminate */
	    s = j*persize;
	    for (k = 0; k < persize; ++k) /* No D_ format in C */
		if ( buf[s+k] == 'D' || buf[s+k] == 'd' ) buf[s+k] = 'E';
	    destination[i++] = atof(&buf[s]);
	    buf[(j+1)*persize] = tmp;     /* recover the char at that place */
	}
    }

    return 0;
}